

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O2

void __thiscall
Liby::
BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
::BlockingQueue(BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
                *this,initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
                      elements)

{
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>_>
  *this_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  *__args;
  long lVar1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  *e;
  
  __args = elements._M_array;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  this_00 = &this->queue_;
  (this->queue_).
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->queue_).
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->queue_).
  super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::condition_variable::condition_variable(&this->cond_);
  for (lVar1 = elements._M_len * 0x68; lVar1 != 0; lVar1 = lVar1 + -0x68) {
    std::__cxx11::
    list<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>>>
    ::
    emplace_back<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>const&>
              ((list<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>>>
                *)this_00,__args);
    __args = __args + 1;
  }
  return;
}

Assistant:

BlockingQueue(std::initializer_list<T> elements = {}) {
        for (auto &e : elements) {
            queue_.emplace_back(e);
        }
    }